

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_encoder.hpp
# Opt level: O0

bool __thiscall
jsoncons::bson::basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::
visit_double(basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *this,
            double val,semantic_tag param_3,ser_context *param_4,error_code *ec)

{
  bool bVar1;
  error_code *in_RCX;
  back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> in_RDI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_XMM0_Qa;
  uint8_t in_stack_0000007f;
  basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *in_stack_00000080;
  undefined8 in_stack_ffffffffffffffc8;
  bson_errc __e;
  
  __e = (bson_errc)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  bVar1 = std::
          vector<jsoncons::bson::basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::bson::basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>_>
          ::empty((vector<jsoncons::bson::basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::bson::basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>_>
                   *)in_RCX);
  if (bVar1) {
    std::error_code::operator=(in_RCX,__e);
  }
  else {
    before_value(in_stack_00000080,in_stack_0000007f);
    std::back_inserter<std::vector<unsigned_char,std::allocator<unsigned_char>>>(in_XMM0_Qa);
    binary::
    native_to_little<double,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>,jsoncons::detail::endian>
              ((double)in_XMM0_Qa,in_RDI);
  }
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_double(double val, 
        semantic_tag,
        const ser_context&,
        std::error_code& ec) override
    {
        if (stack_.empty())
        {
            ec = bson_errc::expected_bson_document;
            JSONCONS_VISITOR_RETURN;
        }
        before_value(jsoncons::bson::bson_type::double_type);
        binary::native_to_little(val,std::back_inserter(buffer_));
        JSONCONS_VISITOR_RETURN;
    }